

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bst.c
# Opt level: O1

vmd_bst_node_t * vmd_bst_node_adj(vmd_bst_node_t *node,int dir)

{
  undefined1 *puVar1;
  vmd_bst_node_t *pvVar2;
  vmd_bst_node_t *pvVar3;
  
  if (node->child[dir] == (vmd_bst_node_t *)0x0) {
    do {
      pvVar3 = node->parent;
      if (node == pvVar3) {
        return node;
      }
      puVar1 = &node->field_0x20;
      node = pvVar3;
    } while ((*(uint *)puVar1 >> 3 & 1) == dir);
  }
  else {
    pvVar2 = node->child[dir];
    do {
      pvVar3 = pvVar2;
      pvVar2 = pvVar3->child[dir == 0];
    } while (pvVar3->child[dir == 0] != (vmd_bst_node_t *)0x0);
  }
  return pvVar3;
}

Assistant:

bst_node_t *
bst_node_adj(bst_node_t *node, int dir)
{
	if (node->child[dir] != NULL)
		return bst_node_child_most(node->child[dir], !dir);

	for (; !bst_node_is_end(node); node = node->parent) {
		if (node->idx != dir)
			return node->parent;
	}

	return node;
}